

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.cc
# Opt level: O3

bool __thiscall draco::CornerTable::IsDegenerated(CornerTable *this,FaceIndex face)

{
  pointer pIVar1;
  uint uVar2;
  uint uVar3;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> IVar4;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> IVar5;
  
  if (face.value_ == 0xffffffff) {
    return true;
  }
  if (face.value_ == 0x55555555) {
    return true;
  }
  uVar2 = face.value_ * 3;
  pIVar1 = (this->corner_to_vertex_map_).vector_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = uVar2 - 2;
  if (0x55555555 < (uVar2 + 1) * -0x55555555) {
    uVar3 = uVar2 + 1;
  }
  if (uVar3 == 0xffffffff) {
    IVar5.value_ = 0xffffffff;
  }
  else {
    IVar5.value_ = pIVar1[uVar3].value_;
  }
  if (face.value_ < 0x55555556) {
    uVar3 = uVar2 + 2;
    if (uVar3 == 0xffffffff) {
      IVar4.value_ = 0xffffffff;
      goto LAB_0013213d;
    }
  }
  else {
    uVar3 = uVar2 - 1;
  }
  IVar4.value_ = pIVar1[uVar3].value_;
LAB_0013213d:
  return IVar5.value_ == IVar4.value_ ||
         (pIVar1[uVar2].value_ == IVar4.value_ || pIVar1[uVar2].value_ == IVar5.value_);
}

Assistant:

bool CornerTable::IsDegenerated(FaceIndex face) const {
  if (face == kInvalidFaceIndex) {
    return true;
  }
  const CornerIndex first_face_corner = FirstCorner(face);
  const VertexIndex v0 = Vertex(first_face_corner);
  const VertexIndex v1 = Vertex(Next(first_face_corner));
  const VertexIndex v2 = Vertex(Previous(first_face_corner));
  if (v0 == v1 || v0 == v2 || v1 == v2) {
    return true;
  }
  return false;
}